

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

bool __thiscall LockedPool::new_arena(LockedPool *this,size_t size,size_t align)

{
  size_t *psVar1;
  _Head_base<0UL,_LockedPageAllocator_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  void *pvVar6;
  _Node *p_Var7;
  long in_FS_OFFSET;
  void *addr;
  bool locked;
  _Head_base<0UL,_LockedPageAllocator_*,_false> local_50;
  void *local_48;
  char local_39;
  size_t local_38;
  ulong local_30;
  long local_28;
  ulong uVar5;
  undefined4 extraout_var_00;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = align;
  local_30 = size;
  if ((this->arenas).
      super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->arenas) {
    local_30 = size;
    iVar4 = (*((this->allocator)._M_t.
               super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>
               .super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl)->
              _vptr_LockedPageAllocator[4])();
    uVar5 = CONCAT44(extraout_var,iVar4);
    if ((uVar5 != 0) && (local_30 = size, uVar5 < size)) {
      size = uVar5;
      local_30 = uVar5;
    }
  }
  _Var2._M_head_impl =
       (this->allocator)._M_t.
       super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
       super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
       super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl;
  iVar4 = (*(_Var2._M_head_impl)->_vptr_LockedPageAllocator[2])(_Var2._M_head_impl,size,&local_39);
  pvVar6 = (void *)CONCAT44(extraout_var_00,iVar4);
  local_48 = pvVar6;
  if (pvVar6 == (void *)0x0) {
LAB_0077ae59:
    bVar3 = false;
  }
  else {
    if (local_39 == '\x01') {
      this->cumulative_bytes_locked = this->cumulative_bytes_locked + size;
    }
    else if ((this->lf_cb != (LockingFailed_Callback)0x0) && (bVar3 = (*this->lf_cb)(), !bVar3)) {
      _Var2._M_head_impl =
           (this->allocator)._M_t.
           super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>.
           _M_t.
           super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
           super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl;
      (*(_Var2._M_head_impl)->_vptr_LockedPageAllocator[3])(_Var2._M_head_impl,pvVar6,size);
      goto LAB_0077ae59;
    }
    local_50._M_head_impl =
         (this->allocator)._M_t.
         super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
         super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
         super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl;
    p_Var7 = std::__cxx11::
             list<LockedPool::LockedPageArena,std::allocator<LockedPool::LockedPageArena>>::
             _M_create_node<LockedPageAllocator*,void*&,unsigned_long&,unsigned_long&>
                       ((list<LockedPool::LockedPageArena,std::allocator<LockedPool::LockedPageArena>>
                         *)&this->arenas,&local_50._M_head_impl,&local_48,&local_30,&local_38);
    std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var7);
    psVar1 = &(this->arenas).
              super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool LockedPool::new_arena(size_t size, size_t align)
{
    bool locked;
    // If this is the first arena, handle this specially: Cap the upper size
    // by the process limit. This makes sure that the first arena will at least
    // be locked. An exception to this is if the process limit is 0:
    // in this case no memory can be locked at all so we'll skip past this logic.
    if (arenas.empty()) {
        size_t limit = allocator->GetLimit();
        if (limit > 0) {
            size = std::min(size, limit);
        }
    }
    void *addr = allocator->AllocateLocked(size, &locked);
    if (!addr) {
        return false;
    }
    if (locked) {
        cumulative_bytes_locked += size;
    } else if (lf_cb) { // Call the locking-failed callback if locking failed
        if (!lf_cb()) { // If the callback returns false, free the memory and fail, otherwise consider the user warned and proceed.
            allocator->FreeLocked(addr, size);
            return false;
        }
    }
    arenas.emplace_back(allocator.get(), addr, size, align);
    return true;
}